

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

Status __thiscall
flatbuffers::anon_unknown_26::RustCodeGenerator::GenerateRootFile
          (RustCodeGenerator *this,Parser *parser,string *path)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  long *name;
  _Alloc_hider _Var4;
  bool bVar5;
  Status SVar6;
  pointer pcVar7;
  pointer ppEVar8;
  pointer ppSVar9;
  _Link_type __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  Module root_module;
  CodeWriter code;
  Config result;
  long *local_600 [2];
  long local_5f0 [2];
  string local_5e0;
  long *local_5c0;
  size_t local_5b8;
  long local_5b0 [2];
  string local_5a0;
  string local_580;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_560;
  undefined1 local_530 [8];
  undefined4 local_528 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
  *local_520;
  undefined4 *local_518;
  undefined4 *local_510;
  undefined8 local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_500;
  Namer local_4e8;
  undefined1 local_360 [440];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_180 [136];
  string local_f8 [104];
  string local_90 [32];
  string local_70 [64];
  
  SVar6 = OK;
  if ((parser->opts).rust_module_root_file == true) {
    RustDefaultConfig();
    Namer::Config::Config((Config *)local_180,(Config *)local_360);
    std::__cxx11::string::_M_assign((string *)(local_180 + 0x68));
    std::__cxx11::string::_M_assign(local_f8);
    std::__cxx11::string::_M_assign(local_90);
    std::__cxx11::string::_M_assign(local_70);
    (anonymous_namespace)::RustKeywords_abi_cxx11_();
    local_4e8._vptr_Namer = (_func_int **)&PTR__Namer_003f2d00;
    Namer::Config::Config(&local_4e8.config_,(Config *)local_180);
    p_Var1 = &local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header;
    if (local_560._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar3 = &local_4e8.keywords_;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
      ;
    }
    else {
      p_Var2 = &local_560._M_impl.super__Rb_tree_header;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_560._M_impl.super__Rb_tree_header._M_header._M_color;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_560._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_560._M_impl.super__Rb_tree_header._M_header._M_left;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_560._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_560._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
      psVar3 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_560._M_impl;
      local_4e8.keywords_._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_560._M_impl.super__Rb_tree_header._M_node_count;
      local_560._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_560._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_560._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    *(size_t *)((long)&(psVar3->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_560);
    Namer::Config::~Config((Config *)local_180);
    Namer::Config::~Config((Config *)local_360);
    local_518 = local_528;
    local_528[0] = 0;
    local_520 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
                 *)0x0;
    local_508 = 0;
    vStack_500.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_500.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_500.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppEVar8 = (parser->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_510 = local_518;
    if (ppEVar8 !=
        (parser->enums_).vec.
        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        GenerateRustModuleRootFile(flatbuffers::Parser_const&,std::__cxx11::string_const&)::Module::
        Insert(flatbuffers::Namer_const&,flatbuffers::Definition_const__
                  (local_530,&local_4e8,&(*ppEVar8)->super_Definition);
        ppEVar8 = ppEVar8 + 1;
      } while (ppEVar8 !=
               (parser->enums_).vec.
               super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    ppSVar9 = (parser->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppSVar9 !=
        (parser->structs_).vec.
        super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        GenerateRustModuleRootFile(flatbuffers::Parser_const&,std::__cxx11::string_const&)::Module::
        Insert(flatbuffers::Namer_const&,flatbuffers::Definition_const__
                  (local_530,&local_4e8,&(*ppSVar9)->super_Definition);
        ppSVar9 = ppSVar9 + 1;
      } while (ppSVar9 !=
               (parser->structs_).vec.
               super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_580.field_2._M_allocated_capacity._0_2_ = 0x2020;
    local_580._M_string_length = 2;
    local_580.field_2._M_local_buf[2] = '\0';
    local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
    CodeWriter::CodeWriter((CodeWriter *)local_360,&local_580);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,
                      CONCAT53(local_580.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_580.field_2._M_local_buf[2],
                                        local_580.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    local_5e0._M_dataplus._M_p = (pointer)0x46;
    local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
    pcVar7 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_5a0,(ulong)&local_5e0);
    _Var4._M_p = local_5e0._M_dataplus._M_p;
    local_5a0.field_2._M_allocated_capacity = (size_type)local_5e0._M_dataplus._M_p;
    local_5a0._M_dataplus._M_p = pcVar7;
    memcpy(pcVar7,"// Automatically generated by the Flatbuffers compiler. Do not modify.",0x46);
    local_5a0._M_string_length = (size_type)_Var4._M_p;
    pcVar7[_Var4._M_p] = '\0';
    CodeWriter::operator+=((CodeWriter *)local_360,&local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p,
                      (ulong)(local_5a0.field_2._M_allocated_capacity + 1));
    }
    local_5e0.field_2._M_allocated_capacity._0_5_ = 0x6740202f2f;
    local_5e0.field_2._M_allocated_capacity._5_3_ = 0x656e65;
    local_5e0.field_2._8_5_ = 0x6465746172;
    local_5e0._M_string_length = 0xd;
    local_5e0.field_2._M_local_buf[0xd] = '\0';
    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
    CodeWriter::operator+=((CodeWriter *)local_360,&local_5e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      operator_delete(local_5e0._M_dataplus._M_p,
                      CONCAT35(local_5e0.field_2._M_allocated_capacity._5_3_,
                               local_5e0.field_2._M_allocated_capacity._0_5_) + 1);
    }
    GenerateRustModuleRootFile(flatbuffers::Parser_const&,std::__cxx11::string_const&)::Module::
    GenerateImports(flatbuffers::CodeWriter__(local_530,(CodeWriter *)local_360);
    pcVar7 = (path->_M_dataplus)._M_p;
    local_600[0] = local_5f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_600,pcVar7,pcVar7 + path->_M_string_length);
    std::__cxx11::string::append((char *)local_600);
    name = local_600[0];
    std::__cxx11::stringbuf::str();
    bVar5 = SaveFile((char *)name,(char *)local_5c0,local_5b8,false);
    if (local_5c0 != local_5b0) {
      operator_delete(local_5c0,local_5b0[0] + 1);
    }
    if (local_600[0] != local_5f0) {
      operator_delete(local_600[0],local_5f0[0] + 1);
    }
    CodeWriter::Clear((CodeWriter *)local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
    }
    __x = (_Link_type)&std::__cxx11::stringstream::VTT;
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_360 + 0x30));
    std::ios_base::~ios_base((ios_base *)(local_360 + 0xb0));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_360);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_500);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
    ::_M_erase(local_520,__x);
    local_4e8._vptr_Namer = (_func_int **)&PTR__Namer_003f2d00;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_4e8.keywords_._M_t);
    Namer::Config::~Config(&local_4e8.config_);
    SVar6 = (Status)!bVar5;
  }
  return SVar6;
}

Assistant:

Status GenerateRootFile(const Parser &parser,
                          const std::string &path) override {
    if (!GenerateRustModuleRootFile(parser, path)) { return Status::ERROR; }
    return Status::OK;
  }